

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O0

void PrintCall(OutputContext *ctx,char *constantData,uint microcodePos)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint *puVar6;
  int *piVar7;
  uint size_1;
  uint offset_1;
  uint reg_1;
  uint resultType;
  uint targetReg;
  uint size;
  uint offset;
  uint reg;
  uint *microcode;
  uint microcodePos_local;
  char *constantData_local;
  OutputContext *ctx_local;
  
  Print(ctx,"(");
  _offset = (int *)(constantData + (ulong)microcodePos * 4);
  while (*_offset != 1) {
    puVar6 = (uint *)(_offset + 1);
    switch(*_offset) {
    case 2:
      _offset = _offset + 2;
      Print(ctx,"r%d~",(ulong)*puVar6);
      break;
    case 3:
      _offset = _offset + 2;
      Print(ctx,"r%d",(ulong)*puVar6);
      break;
    case 4:
      _offset = _offset + 2;
      Print(ctx,"%d",(ulong)*puVar6);
      break;
    case 5:
      _offset = _offset + 2;
      Print(ctx,"%dL",(ulong)*puVar6);
      break;
    case 6:
      uVar3 = *puVar6;
      puVar6 = (uint *)(_offset + 3);
      uVar1 = _offset[2];
      _offset = _offset + 4;
      uVar2 = *puVar6;
      Print(ctx,"[");
      PrintRegister(ctx,(uchar)uVar3);
      Print(ctx," + 0x%x] x%d",(ulong)uVar1,(ulong)uVar2);
      break;
    default:
      __assert_fail("!\"unknown micro instruction\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                    ,0xaf,"void PrintCall(OutputContext &, char *, unsigned int)");
    }
    if (*_offset != 1) {
      Print(ctx,", ");
    }
  }
  Print(ctx,") -> ");
  piVar7 = _offset + 2;
  uVar3 = _offset[1];
  _offset = _offset + 3;
  iVar4 = *piVar7;
  switch(iVar4) {
  case 0:
    Print(ctx,"void");
    break;
  case 1:
    Print(ctx,"double (r%d",(ulong)uVar3);
    break;
  case 2:
    Print(ctx,"long (r%d",(ulong)uVar3);
    break;
  case 3:
    Print(ctx,"int (r%d",(ulong)uVar3);
    break;
  case 4:
    Print(ctx,"struct (");
    break;
  case 5:
    Print(ctx,"error");
    break;
  default:
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                  ,0xd2,"void PrintCall(OutputContext &, char *, unsigned int)");
  }
  do {
    if (*_offset == 7) {
      if ((iVar4 == 0) || (iVar4 == 5)) {
        Print(ctx," @%d",(ulong)(microcodePos << 2));
      }
      else {
        Print(ctx,") @%d",(ulong)(microcodePos << 2));
      }
      return;
    }
    puVar6 = (uint *)(_offset + 1);
    iVar5 = *_offset;
    if (iVar5 == 8) {
      _offset = _offset + 2;
      Print(ctx,"r%d~",(ulong)*puVar6);
    }
    else if (iVar5 == 9) {
      _offset = _offset + 2;
      Print(ctx,"r%d",(ulong)*puVar6);
    }
    else {
      if (iVar5 != 10) {
        __assert_fail("!\"unknown micro instruction\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                      ,0xeb,"void PrintCall(OutputContext &, char *, unsigned int)");
      }
      uVar3 = *puVar6;
      puVar6 = (uint *)(_offset + 3);
      uVar1 = _offset[2];
      _offset = _offset + 4;
      uVar2 = *puVar6;
      Print(ctx,"[");
      PrintRegister(ctx,(uchar)uVar3);
      Print(ctx," + 0x%x] x%d",(ulong)uVar1,(ulong)uVar2);
    }
    if (*_offset != 7) {
      Print(ctx,", ");
    }
  } while( true );
}

Assistant:

void PrintCall(OutputContext &ctx, char *constantData, unsigned microcodePos)
{
	Print(ctx, "(");

	unsigned *microcode = (unsigned*)constantData + microcodePos;

	while(*microcode != rvmiCall)
	{
		switch(*microcode++)
		{
		case rvmiPush:
			Print(ctx, "r%d~", *microcode++);
			break;
		case rvmiPushQword:
			Print(ctx, "r%d", *microcode++);
			break;
		case rvmiPushImm:
			Print(ctx, "%d", *microcode++);
			break;
		case rvmiPushImmq:
			Print(ctx, "%dL", *microcode++);
			break;
		case rvmiPushMem:
		{
			unsigned reg = *microcode++;
			unsigned offset = *microcode++;
			unsigned size = *microcode++;

			Print(ctx, "[");
			PrintRegister(ctx, (unsigned char)reg);
			Print(ctx, " + 0x%x] x%d", offset, size);
		}
		break;
		default:
			assert(!"unknown micro instruction");
		}

		if(*microcode != rvmiCall)
			Print(ctx, ", ");
	}

	Print(ctx, ") -> ");

	microcode++;

	unsigned targetReg = *microcode++;
	unsigned resultType = *microcode++;

	switch(resultType)
	{
	case rvrVoid:
		Print(ctx, "void");
		break;
	case rvrDouble:
		Print(ctx, "double (r%d", targetReg);
		break;
	case rvrLong:
		Print(ctx, "long (r%d", targetReg);
		break;
	case rvrInt:
		Print(ctx, "int (r%d", targetReg);
		break;
	case rvrStruct:
		Print(ctx, "struct (");
		break;
	case rvrError:
		Print(ctx, "error");
		break;
	default:
		assert(!"unknown type");
	}

	while(*microcode != rvmiReturn)
	{
		switch(*microcode++)
		{
		case rvmiPop:
			Print(ctx, "r%d~", *microcode++);
			break;
		case rvmiPopq:
			Print(ctx, "r%d", *microcode++);
			break;
		case rvmiPopMem:
		{
			unsigned reg = *microcode++;
			unsigned offset = *microcode++;
			unsigned size = *microcode++;

			Print(ctx, "[");
			PrintRegister(ctx, (unsigned char)reg);
			Print(ctx, " + 0x%x] x%d", offset, size);
		}
		break;
		default:
			assert(!"unknown micro instruction");
		}

		if(*microcode != rvmiReturn)
			Print(ctx, ", ");
	}

	if(resultType == rvrVoid || resultType == rvrError)
		Print(ctx, " @%d", microcodePos * 4);
	else
		Print(ctx, ") @%d", microcodePos * 4);
}